

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::Utils::program::getBinary
          (program *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *binary,
          GLenum *binary_format)

{
  uint in_EAX;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLint length;
  undefined8 uStack_38;
  long lVar3;
  
  uStack_38._0_4_ = in_EAX;
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  uStack_38 = (ulong)(uint)uStack_38;
  (**(code **)(lVar3 + 0x9d8))(this->m_program_object_id,0x8741,(long)&uStack_38 + 4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1aa);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(binary,(long)uStack_38._4_4_);
  (**(code **)(lVar3 + 0x980))
            (this->m_program_object_id,
             *(int *)&(binary->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
             (int)(binary->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start,(long)&uStack_38 + 4,binary_format);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetProgramBinary",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1b1);
  return;
}

Assistant:

void Utils::program::getBinary(std::vector<GLubyte>& binary, GLenum& binary_format) const
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get binary size */
	GLint length = 0;
	gl.getProgramiv(m_program_object_id, GL_PROGRAM_BINARY_LENGTH, &length);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	/* Allocate storage */
	binary.resize(length);

	/* Get binary */
	gl.getProgramBinary(m_program_object_id, (GLsizei)binary.size(), &length, &binary_format, &binary[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramBinary");
}